

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_log.c
# Opt level: O3

void lfile_lfun(SRunner *sr,FILE *file,print_output printmode,void *obj,cl_event evt)

{
  switch(evt) {
  case CLINITLOG_SR:
  case CLENDLOG_SR:
  case CLSTART_SR:
  case CLEND_S:
  case CLSTART_T:
    return;
  case CLSTART_S:
    fprintf((FILE *)file,"Running suite %s\n",*obj);
    return;
  case CLEND_SR:
    fwrite("Results for all suites run:\n",0x1c,1,(FILE *)file);
    srunner_fprint(file,sr,CK_MINIMAL);
    return;
  case CLEND_T:
    tr_fprint(file,(TestResult *)obj,CK_VERBOSE);
    return;
  default:
    eprintf("Bad event type received in lfile_lfun",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_log.c"
            ,0x103);
  }
}

Assistant:

void lfile_lfun(SRunner * sr, FILE * file,
                enum print_output printmode CK_ATTRIBUTE_UNUSED, void *obj,
                enum cl_event evt)
{
    TestResult *tr;
    Suite *s;

    switch (evt)
    {
        case CLINITLOG_SR:
            break;
        case CLENDLOG_SR:
            break;
        case CLSTART_SR:
            break;
        case CLSTART_S:
            s = (Suite *)obj;
            fprintf(file, "Running suite %s\n", s->name);
            break;
        case CLEND_SR:
            fprintf(file, "Results for all suites run:\n");
            srunner_fprint(file, sr, CK_MINIMAL);
            break;
        case CLEND_S:
            break;
        case CLSTART_T:
            break;
        case CLEND_T:
            tr = (TestResult *)obj;
            tr_fprint(file, tr, CK_VERBOSE);
            break;
        default:
            eprintf("Bad event type received in lfile_lfun", __FILE__,
                    __LINE__);
    }


}